

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O3

Function * __thiscall
wasm::EquivalentClass::replaceWithThunk
          (EquivalentClass *this,Builder *builder,Function *target,Function *shared,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *extraArgs,bool isReturn)

{
  uintptr_t uVar1;
  Expression **ppEVar2;
  pointer pTVar3;
  string_view target_00;
  Function *pFVar4;
  size_t sVar5;
  Type *pTVar6;
  Call *pCVar7;
  Expression **value;
  Expression **__args;
  Index i;
  ulong uVar8;
  Signature SVar9;
  Type local_88;
  Type targetParams;
  Expression *local_70;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *local_68;
  Function *local_60;
  HeapType *local_58;
  Function *local_50;
  undefined1 auStack_48 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> callOperands;
  
  auStack_48 = (undefined1  [8])0x0;
  callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = &target->type;
  local_68 = extraArgs;
  local_60 = shared;
  local_50 = target;
  SVar9 = HeapType::getSignature(local_58);
  local_88 = SVar9.params.id;
  uVar8 = 0;
  while( true ) {
    sVar5 = wasm::Type::size(&local_88);
    if (sVar5 <= uVar8) break;
    targetParams.id = (uintptr_t)&local_88;
    pTVar6 = wasm::Type::Iterator::operator*((Iterator *)&targetParams);
    uVar1 = pTVar6->id;
    local_70 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
    local_70->_id = LocalGetId;
    *(int *)(local_70 + 1) = (int)uVar8;
    (local_70->type).id = uVar1;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_48,&local_70);
    uVar8 = (ulong)((int)uVar8 + 1);
  }
  __args = (local_68->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (local_68->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (__args != ppEVar2) {
    do {
      if (callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_48,
                   (iterator)
                   callOperands.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,__args);
      }
      else {
        *callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_start = *__args;
        callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             callOperands.
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      __args = __args + 1;
    } while (__args != ppEVar2);
  }
  target_00 = (local_60->super_Importable).super_Named.name.super_IString.str;
  SVar9 = HeapType::getSignature(local_58);
  pCVar7 = Builder::makeCall(builder,(Name)target_00,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             auStack_48,SVar9.results.id,isReturn);
  pFVar4 = local_50;
  pTVar3 = (local_50->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_50->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar3) {
    (local_50->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar3;
  }
  local_50->body = (Expression *)pCVar7;
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)callOperands.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return pFVar4;
}

Assistant:

Function*
EquivalentClass::replaceWithThunk(Builder& builder,
                                  Function* target,
                                  Function* shared,
                                  const std::vector<ParamInfo>& params,
                                  const std::vector<Expression*>& extraArgs,
                                  bool isReturn) {
  std::vector<Expression*> callOperands;
  Type targetParams = target->getParams();
  for (Index i = 0; i < targetParams.size(); i++) {
    callOperands.push_back(builder.makeLocalGet(i, targetParams[i]));
  }

  for (const auto& value : extraArgs) {
    callOperands.push_back(value);
  }

  auto ret = builder.makeCall(
    shared->name, callOperands, target->getResults(), isReturn);
  target->vars.clear();
  target->body = ret;
  return target;
}